

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void opj_tcd_code_block_enc_deallocate(opj_tcd_precinct_t *p_precinct)

{
  uint uVar1;
  opj_tcd_pass_t **ppoVar2;
  
  if ((p_precinct->cblks).enc != (opj_tcd_cblk_enc_t *)0x0) {
    if (0x3f < p_precinct->block_size) {
      uVar1 = p_precinct->block_size >> 6;
      ppoVar2 = &((p_precinct->cblks).enc)->passes;
      do {
        if (((opj_tcd_cblk_enc_t *)(ppoVar2 + -2))->data != (OPJ_BYTE *)0x0) {
          opj_free(((opj_tcd_cblk_enc_t *)(ppoVar2 + -2))->data + -1);
          ((opj_tcd_cblk_enc_t *)(ppoVar2 + -2))->data = (OPJ_BYTE *)0x0;
        }
        if ((opj_tcd_layer_t *)ppoVar2[-1] != (opj_tcd_layer_t *)0x0) {
          opj_free((opj_tcd_layer_t *)ppoVar2[-1]);
          ppoVar2[-1] = (opj_tcd_pass_t *)0x0;
        }
        if (*ppoVar2 != (opj_tcd_pass_t *)0x0) {
          opj_free(*ppoVar2);
          *ppoVar2 = (opj_tcd_pass_t *)0x0;
        }
        ppoVar2 = ppoVar2 + 8;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    opj_free((p_precinct->cblks).blocks);
    (p_precinct->cblks).enc = (opj_tcd_cblk_enc_t *)0x0;
  }
  return;
}

Assistant:

static void opj_tcd_code_block_enc_deallocate(opj_tcd_precinct_t * p_precinct)
{
    OPJ_UINT32 cblkno, l_nb_code_blocks;

    opj_tcd_cblk_enc_t * l_code_block = p_precinct->cblks.enc;
    if (l_code_block) {
        l_nb_code_blocks = p_precinct->block_size / (OPJ_UINT32)sizeof(
                               opj_tcd_cblk_enc_t);

        for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno)  {
            if (l_code_block->data) {
                /* We refer to data - 1 since below we incremented it */
                /* in opj_tcd_code_block_enc_allocate_data() */
                opj_free(l_code_block->data - 1);
                l_code_block->data = 00;
            }

            if (l_code_block->layers) {
                opj_free(l_code_block->layers);
                l_code_block->layers = 00;
            }

            if (l_code_block->passes) {
                opj_free(l_code_block->passes);
                l_code_block->passes = 00;
            }
            ++l_code_block;
        }

        opj_free(p_precinct->cblks.enc);

        p_precinct->cblks.enc = 00;
    }
}